

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O0

SimilarCatalogEntry * __thiscall
duckdb::CatalogSet::SimilarEntry(CatalogSet *this,CatalogTransaction transaction,string *name)

{
  bool bVar1;
  reference ppVar2;
  long in_RSI;
  SimilarCatalogEntry *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
  *in_stack_00000008;
  SimilarCatalogEntry *in_stack_00000010;
  string *in_stack_00000028;
  double entry_score;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>
  *kv;
  iterator __end1;
  iterator __begin1;
  case_insensitive_tree_t<unique_ptr<CatalogEntry>_> *__range1;
  CatalogSet *in_stack_00000080;
  CatalogTransaction in_stack_00000090;
  unique_lock<std::mutex> lock;
  SimilarCatalogEntry *result;
  mutex_type *in_stack_ffffffffffffff18;
  unique_lock<std::mutex> *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff40;
  _Self local_80;
  _Self local_78;
  case_insensitive_tree_t<unique_ptr<CatalogEntry>_> *local_70;
  undefined1 local_65;
  
  ::std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  CreateDefaultEntries(in_stack_00000080,in_stack_00000090,(unique_lock<std::mutex> *)__range1);
  local_65 = 0;
  SimilarCatalogEntry::SimilarCatalogEntry(in_stack_00000010);
  local_70 = CatalogEntryMap::Entries((CatalogEntryMap *)(in_RSI + 0x30));
  local_78._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
       ::begin(in_stack_00000008);
  local_80._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
       ::end(in_stack_00000008);
  while (bVar1 = ::std::operator!=(&local_78,&local_80), bVar1) {
    ppVar2 = ::std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>
                          *)0x2a98290);
    in_stack_ffffffffffffff40 =
         (string *)StringUtil::SimilarityRating(in_stack_ffffffffffffff40,in_stack_00000028);
    if (in_RDI->score <= (double)in_stack_ffffffffffffff40 &&
        (double)in_stack_ffffffffffffff40 != in_RDI->score) {
      in_RDI->score = (double)in_stack_ffffffffffffff40;
      ::std::__cxx11::string::operator=((string *)in_RDI,(string *)ppVar2);
    }
    ::std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>
                  *)in_stack_00000010);
  }
  local_65 = 1;
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_00000010);
  return in_RDI;
}

Assistant:

SimilarCatalogEntry CatalogSet::SimilarEntry(CatalogTransaction transaction, const string &name) {
	unique_lock<mutex> lock(catalog_lock);
	CreateDefaultEntries(transaction, lock);

	SimilarCatalogEntry result;
	for (auto &kv : map.Entries()) {
		auto entry_score = StringUtil::SimilarityRating(kv.first, name);
		if (entry_score > result.score) {
			result.score = entry_score;
			result.name = kv.first;
		}
	}
	return result;
}